

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  Vector *result_00;
  Vector *pVVar4;
  Vector *pVVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  idx_t iVar8;
  idx_t iVar9;
  long lVar10;
  long lVar11;
  idx_t offset_00;
  idx_t i_1;
  ulong uVar12;
  string_t value;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_78;
  
  offset_00 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  result_00 = (Vector *)ListVector::GetListSize(result);
  lVar10 = 0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar9 = iVar8;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar9 = (idx_t)(local_78.sel)->sel_vector[iVar8];
    }
    if (**(long **)(local_78.data + iVar9 * 8) != 0) {
      lVar10 = lVar10 + *(long *)(**(long **)(local_78.data + iVar9 * 8) + 0x30);
    }
  }
  ListVector::Reserve(result,(idx_t)(&result_00->vector_type + lVar10));
  pVVar4 = MapVector::GetKeys(result);
  pVVar5 = MapVector::GetValues(result);
  pdVar2 = result->data;
  pdVar3 = pVVar5->data;
  for (uVar12 = 0; uVar12 != count; uVar12 = uVar12 + 1) {
    uVar6 = uVar12;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(local_78.sel)->sel_vector[uVar12];
    }
    lVar10 = **(long **)(local_78.data + uVar6 * 8);
    if (lVar10 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,offset + uVar12);
    }
    else {
      lVar11 = (offset + uVar12) * 0x10;
      plVar1 = (long *)(pdVar2 + lVar11);
      *(Vector **)(pdVar2 + lVar11) = result_00;
      for (p_Var7 = *(_Rb_tree_node_base **)(lVar10 + 0x20);
          p_Var7 != (_Rb_tree_node_base *)(lVar10 + 0x10);
          p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7)) {
        value.value.pointer.ptr = (char *)pVVar4;
        value.value._0_8_ = p_Var7[1]._M_parent;
        HistogramStringFunctor::HistogramFinalize<duckdb::string_t>
                  (*(HistogramStringFunctor **)(p_Var7 + 1),value,result_00,offset_00);
        *(_Base_ptr *)(pdVar3 + (long)result_00 * 8) = p_Var7[1]._M_left;
        result_00 = (Vector *)&result_00->field_0x1;
      }
      plVar1[1] = (long)result_00 - *plVar1;
    }
  }
  ListVector::SetListSize(result,(idx_t)result_00);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}